

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O1

void __thiscall
solitaire::graphics::SDLGraphicsSystemWithLoadedTexture_renderTextureSuccessfully_Test::TestBody
          (SDLGraphicsSystemWithLoadedTexture_renderTextureSuccessfully_Test *this)

{
  int iVar1;
  WrapperMock *pWVar2;
  SDLGraphicsSystemWithLoadedTexture *this_00;
  undefined8 *puVar3;
  TypedExpectation<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  *this_01;
  ActionInterface<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  *impl;
  MatcherBase<const_std::optional<SDL_Rect>_&> local_150;
  SDLGraphicsSystemWithLoadedTexture *local_138;
  WrapperMock *local_130;
  int *local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  TextureId local_114;
  MatcherBase<const_std::optional<SDL_Rect>_&> local_110;
  _Any_data local_f8;
  code *local_e8;
  MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&> local_d8;
  MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&> local_c0
  ;
  undefined8 local_a8;
  undefined8 local_a0;
  MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  local_98;
  
  pWVar2 = &((this->super_SDLGraphicsSystemWithLoadedTexture).
             super_SDLGraphicsSystemWithCreatedWindowTests.super_SDLGraphicsSystemTests.sdlMock.
            rawPointer)->super_WrapperMock;
  local_a0 = 2;
  testing::internal::PointerMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
              *)&local_c0,(PointerMatcher *)&local_a0);
  local_a8 = 3;
  testing::internal::PointerMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&> *)
             &local_d8,(PointerMatcher *)&local_a8);
  local_138 = &this->super_SDLGraphicsSystemWithLoadedTexture;
  local_130 = pWVar2;
  puVar3 = (undefined8 *)operator_new(0x18);
  *puVar3 = &PTR__MatcherDescriberInterface_0032dd58;
  puVar3[1] = 0xf0000000a;
  puVar3[2] = 0x1e00000014;
  local_150.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0032b040;
  local_150.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<std::optional<SDL_Rect>const&>::
       GetVTable<testing::internal::MatcherBase<std::optional<SDL_Rect>const&>::ValuePolicy<testing::MatcherInterface<std::optional<SDL_Rect>const&>const*,true>>()
       ::kVTable;
  local_150.buffer_.ptr = operator_new(0x10);
  ((local_150.buffer_.shared)->ref).super___atomic_base<int>._M_i = 1;
  *(undefined8 **)(local_150.buffer_.i + 8) = puVar3;
  local_150.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0032b098;
  puVar3 = (undefined8 *)operator_new(0x18);
  *puVar3 = &PTR__MatcherDescriberInterface_0032dd58;
  puVar3[1] = 0x110000000d;
  puVar3[2] = 0x1e00000014;
  local_110.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0032b040;
  local_110.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<std::optional<SDL_Rect>const&>::
       GetVTable<testing::internal::MatcherBase<std::optional<SDL_Rect>const&>::ValuePolicy<testing::MatcherInterface<std::optional<SDL_Rect>const&>const*,true>>()
       ::kVTable;
  local_110.buffer_.ptr = operator_new(0x10);
  ((local_110.buffer_.shared)->ref).super___atomic_base<int>._M_i = 1;
  *(undefined8 **)(local_110.buffer_.i + 8) = puVar3;
  local_110.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0032b098;
  SDL::WrapperMock::gmock_renderCopy
            (&local_98,local_130,
             (Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
              *)&local_c0,
             (Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&> *)
             &local_d8,(Matcher<const_std::optional<SDL_Rect>_&> *)&local_150,
             (Matcher<const_std::optional<SDL_Rect>_&> *)&local_110);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
            ::InternalExpectedAt
                      (&local_98,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0x16b,"*sdlMock",
                       "renderCopy(Pointer(rendererPtr), Pointer(texture0Ptr), IsOptionalEq(srcRect), IsOptionalEq(dstRect))"
                      );
  local_128 = (int *)operator_new(4);
  *local_128 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_120,local_128);
  impl = (ActionInterface<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
          *)operator_new(0x10);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_003306d8;
  iVar1 = *local_128;
  *(int *)&impl[1]._vptr_ActionInterface = iVar1;
  *(int *)((long)&impl[1]._vptr_ActionInterface + 4) = iVar1;
  testing::
  Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  ::Action((Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
            *)&local_f8,impl);
  testing::internal::
  TypedExpectation<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  ::WillOnce(this_01,(Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
                      *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  if (local_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120._M_pi);
  }
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>::
  ~MatcherBase((MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
                *)&local_98.matchers_.
                   super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
                   .
                   super__Head_base<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_false>
              );
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>::
  ~MatcherBase((MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>
                *)&local_98.matchers_.
                   super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
                   .
                   super__Tuple_impl<1UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
                   .
                   super__Head_base<1UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_false>
              );
  testing::internal::MatcherBase<const_std::optional<SDL_Rect>_&>::~MatcherBase
            ((MatcherBase<const_std::optional<SDL_Rect>_&> *)
             &local_98.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
              .
              super__Tuple_impl<2UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
              .super__Head_base<2UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_false>);
  testing::internal::MatcherBase<const_std::optional<SDL_Rect>_&>::~MatcherBase
            ((MatcherBase<const_std::optional<SDL_Rect>_&> *)&local_98.matchers_);
  testing::internal::MatcherBase<const_std::optional<SDL_Rect>_&>::~MatcherBase(&local_110);
  testing::internal::MatcherBase<const_std::optional<SDL_Rect>_&>::~MatcherBase(&local_150);
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>::
  ~MatcherBase(&local_d8);
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>::
  ~MatcherBase(&local_c0);
  this_00 = local_138;
  local_114.t = (anonymous_namespace)::textureId0;
  SDLGraphicsSystem::renderTexture
            (&(local_138->super_SDLGraphicsSystemWithCreatedWindowTests).
              super_SDLGraphicsSystemTests.system,&local_114,
             (Position *)&(anonymous_namespace)::texturePosition,
             (Area *)(anonymous_namespace)::textureArea);
  SDLGraphicsSystemWithLoadedTexture::expectQuitSystemWithLoadedTexture(this_00);
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemWithLoadedTexture, renderTextureSuccessfully) {
    EXPECT_CALL(*sdlMock,
        renderCopy(Pointer(rendererPtr), Pointer(texture0Ptr),
                   IsOptionalEq(srcRect), IsOptionalEq(dstRect))
    ).WillOnce(Return(success));

    system.renderTexture(textureId0, texturePosition, textureArea);
    expectQuitSystemWithLoadedTexture();
}